

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converters.cpp
# Opt level: O1

converters * __thiscall
pobr::imgProcessing::utils::converters::grayscaleImage(converters *this,Mat *img)

{
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  cv::Mat::clone();
  pcStack_20 = std::
               _Function_handler<void_(const_unsigned_long_&,_const_unsigned_long_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mdziekon[P]eiti-pobr-logo-recognition/src/img-processing/utils/converters.cpp:65:9)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(const_unsigned_long_&,_const_unsigned_long_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mdziekon[P]eiti-pobr-logo-recognition/src/img-processing/utils/converters.cpp:65:9)>
             ::_M_manager;
  local_38._M_unused._0_8_ = (undefined8)img;
  local_38._8_8_ = this;
  matrixOps::forEachPixel
            (img,(function<void_(const_unsigned_long_&,_const_unsigned_long_&)> *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  return this;
}

Assistant:

cv::Mat
converters::grayscaleImage(const cv::Mat& img)
{
    auto resultImg = img.clone();

    matrixOps::forEachPixel(
        img,
        [&](const uint64_t& x, const uint64_t& y) -> void
        {
            auto& thisPixel = img.at<cv::Vec3b>(y, x);

            uint8_t value = (thisPixel[0] + thisPixel[1] + thisPixel[2]) / 3;

            resultImg.at<cv::Vec3b>(y, x)[0] = value;
            resultImg.at<cv::Vec3b>(y, x)[1] = value;
            resultImg.at<cv::Vec3b>(y, x)[2] = value;
        }
    );

    return resultImg;
}